

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO_Action_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::IO_Action_PDU::Encode(IO_Action_PDU *this,KDataStream *stream)

{
  pointer pKVar1;
  pointer pKVar2;
  
  IO_Header::Encode(&this->super_IO_Header,stream);
  (*(this->m_RecEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_RecEntityID,stream);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32ReqId);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16WrTyp);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16SimSrc);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16ActTyp);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16ActPhs);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32Padding);
  (*(this->m_AtkEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_AtkEntityID,stream);
  (*(this->m_TgtEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_TgtEntityID,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16NumStdVarRec);
  pKVar1 = (this->m_vStdVarRecs).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar2 = (this->m_vStdVarRecs).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar2 != pKVar1; pKVar2 = pKVar2 + 1) {
    (*(pKVar2->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[5])(pKVar2->m_pRef,stream);
  }
  return;
}

Assistant:

void IO_Action_PDU::Encode( KDataStream & stream ) const
{
    IO_Header::Encode( stream );

    stream << KDIS_STREAM m_RecEntityID
           << m_ui32ReqId
           << m_ui16WrTyp
           << m_ui16SimSrc
           << m_ui16ActTyp
           << m_ui16ActPhs
           << m_ui32Padding
           << KDIS_STREAM m_AtkEntityID
           << KDIS_STREAM m_TgtEntityID
           << m_ui16Padding
           << m_ui16NumStdVarRec;

    vector<StdVarPtr>::const_iterator citr = m_vStdVarRecs.begin();
    vector<StdVarPtr>::const_iterator citrEnd = m_vStdVarRecs.end();
    for( ; citr != citrEnd; ++citr )
    {
        ( *citr )->Encode( stream );
    }
}